

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O3

uint __thiscall Future<void>::Private::ThreadPool::ThreadContext::proc(ThreadContext *this)

{
  usize *puVar1;
  usize uVar2;
  ThreadPool *pTVar3;
  code *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  Node *pNVar7;
  ulong uVar9;
  void *__stat_loc;
  bool bVar10;
  undefined8 *puVar8;
  
  pTVar3 = this->_pool;
LAB_00119704:
  uVar9 = (pTVar3->_queue)._head;
  do {
    uVar6 = uVar9;
    pNVar7 = (pTVar3->_queue)._queue;
    uVar9 = (pTVar3->_queue)._capacityMask & uVar6;
    __stat_loc = (void *)(uVar9 * 0x20);
    if (pNVar7[uVar9].head != uVar6) {
      LOCK();
      puVar1 = &(pTVar3->_enqueuedSignal)._state;
      uVar2 = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      if (uVar2 == 1) {
        Signal::reset(&(pTVar3->_enqueuedSignal)._signal);
      }
      uVar9 = (pTVar3->_queue)._head;
      goto LAB_00119759;
    }
    puVar1 = &(pTVar3->_queue)._head;
    LOCK();
    uVar9 = *puVar1;
    bVar10 = uVar6 == uVar9;
    if (bVar10) {
      *puVar1 = uVar6 + 1;
      uVar9 = uVar6;
    }
    UNLOCK();
  } while (!bVar10);
  goto LAB_00119787;
  while( true ) {
    puVar1 = &(pTVar3->_queue)._head;
    LOCK();
    uVar9 = *puVar1;
    bVar10 = uVar6 == uVar9;
    if (bVar10) {
      *puVar1 = uVar6 + 1;
      uVar9 = uVar6;
    }
    UNLOCK();
    if (bVar10) break;
LAB_00119759:
    uVar6 = uVar9;
    pNVar7 = (pTVar3->_queue)._queue;
    uVar9 = (pTVar3->_queue)._capacityMask & uVar6;
    __stat_loc = (void *)(uVar9 * 0x20);
    if (pNVar7[uVar9].head != uVar6) {
      if ((pTVar3->_enqueuedSignal)._state == 0) {
        Signal::wait(&(pTVar3->_enqueuedSignal)._signal,__stat_loc);
      }
      goto LAB_00119704;
    }
  }
LAB_00119787:
  puVar8 = (undefined8 *)((long)&(pNVar7->data).proc + (long)__stat_loc);
  pcVar4 = (code *)*puVar8;
  uVar5 = puVar8[1];
  LOCK();
  puVar8[2] = uVar6 + (pTVar3->_queue)._capacity;
  UNLOCK();
  LOCK();
  puVar1 = &(pTVar3->_dequeuedSignal)._state;
  uVar2 = *puVar1;
  *puVar1 = 1;
  UNLOCK();
  if (uVar2 == 0) {
    Signal::set(&(pTVar3->_dequeuedSignal)._signal);
  }
  if (pcVar4 == (code *)0x0) {
    this->_terminated = true;
    return 0;
  }
  (*pcVar4)(uVar5);
  LOCK();
  puVar1 = &this->_pool->_processedJobs;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  goto LAB_00119704;
}

Assistant:

uint proc()
      {
        Job job;
        LockFreeQueue<Job> &queue = _pool->_queue;
        FastSignal &enqueuedSignal = _pool->_enqueuedSignal;
        FastSignal &dequeuedSignal = _pool->_dequeuedSignal;
        for (;;)
        {
          while (!queue.pop(job))
          {
            enqueuedSignal.reset();
            if (queue.pop(job))
              break;
            enqueuedSignal.wait();
          }
          dequeuedSignal.set();
          if (job.proc)
          {
            job.proc(job.args);
            Atomic::increment(_pool->_processedJobs);
          }
          else
            break;
        }
        _terminated = true;
        return 0;
      }